

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_current_line(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,render_handler *handler,
                   context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *comp)

{
  bool bVar1;
  bool bVar2;
  bool output;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *comp_local;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  render_handler *handler_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  bVar1 = true;
  if ((((ctx->line_buffer).contained_section_tag & 1U) != 0) &&
     (bVar2 = line_buffer_state<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::is_empty_or_contains_only_whitespace(&ctx->line_buffer), bVar2)) {
    bVar1 = false;
  }
  if ((bVar1) &&
     (Catch::clara::std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(handler,&(ctx->line_buffer).data),
     comp != (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0)) {
    Catch::clara::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(handler,&comp->text);
  }
  line_buffer_state<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::clear(&ctx->line_buffer);
  return;
}

Assistant:

void render_current_line(const render_handler& handler, context_internal<string_type>& ctx, const component<string_type>* comp) const {
        // We're at the end of a line, so check the line buffer state to see
        // if the line had tags in it, and also if the line is now empty or
        // contains whitespace only. if this situation is true, skip the line.
        bool output = true;
        if (ctx.line_buffer.contained_section_tag && ctx.line_buffer.is_empty_or_contains_only_whitespace()) {
            output = false;
        }
        if (output) {
            handler(ctx.line_buffer.data);
            if (comp) {
                handler(comp->text);
            }
        }
        ctx.line_buffer.clear();
    }